

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O0

usize __thiscall
Console::Prompt::Private::readBufferedEscapedSequence(Private *this,char *seqStart,char *buffer)

{
  bool bVar1;
  usize uVar2;
  byte *pbVar3;
  char *start;
  char *buffer_local;
  char *seqStart_local;
  Private *this_local;
  
  start = buffer;
  while( true ) {
    bVar1 = Buffer::isEmpty(&this->bufferedInput);
    if (bVar1) {
      uVar2 = readUnbufferedEscapedSequence(this,seqStart,start);
      return (usize)(start + (uVar2 - (long)buffer));
    }
    pbVar3 = Buffer::operator_cast_to_unsigned_char_(&this->bufferedInput);
    *start = *pbVar3;
    Buffer::removeFront(&this->bufferedInput,1);
    if ((seqStart[1] != '[') || (bVar1 = isSeqAttributeChar(*start), !bVar1)) break;
    start = start + 1;
  }
  start[1] = '\0';
  return (usize)(start + 1 + -(long)buffer);
}

Assistant:

usize readBufferedEscapedSequence(const char* seqStart, char* buffer)
  {
    for(char* start = buffer;;)
    {
      if(bufferedInput.isEmpty())
        return buffer - start + readUnbufferedEscapedSequence(seqStart, buffer);
      *buffer = *(const char*)(const byte*)bufferedInput;
      bufferedInput.removeFront(1);
      if(seqStart[1] != '[' || !isSeqAttributeChar(*buffer))
      {
        ++buffer;
        *buffer = '\0';
        return buffer - start;
      }
      ++buffer;
    }
  }